

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O1

void __thiscall Enterprise::Nick::output_character<4,6>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  
  if (0 < columns) {
    puVar2 = this->ram_;
    lVar3 = 0;
    do {
      bVar1 = puVar2[(this->line_data_pointer_[1] & 0x3ff) << 6 |
                     puVar2[*(int *)this->line_data_pointer_ + (int)lVar3 & 0xffff] & 0x3f];
      this->last_read_ = bVar1;
      target[lVar3 * 2] =
           this->palette_[((uint)(bVar1 >> 7) | bVar1 >> 3 & 4) + (bVar1 & 2) * 4 | bVar1 >> 2 & 2];
      target[lVar3 * 2 + 1] =
           this->palette_[bVar1 >> 6 & 1 | bVar1 >> 1 & 2 | (bVar1 >> 2 & 4) + (bVar1 & 1) * 8];
      lVar3 = lVar3 + 1;
    } while (columns != (int)lVar3);
  }
  return;
}

Assistant:

void Nick::output_character(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	for(int c = 0; c < columns; c++) {
		const uint8_t character = ram_[(line_data_pointer_[0] + c) & 0xffff];
		const uint8_t pixels = ram_[(
			(line_data_pointer_[1] << index_bits) +
			(character & ((1 << index_bits) - 1))
		) & 0xffff];
		last_read_ = pixels;

		switch(bpp) {
			default:
				assert(false);
			break;

			case 1: {
				// This applies ALTIND0 and ALTIND1.
				const uint16_t *palette = alt_ind_palettes[character >> 6];
				output1bpp(pixels);
			} break;

			case 2:		output2bpp(pixels);		break;
			case 4:		output4bpp(pixels);		break;
			case 8:		output8bpp(pixels);		break;
		}
	}
}